

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O0

string * __thiscall
cmTarget::ImportedGetFullPath
          (string *__return_storage_ptr__,cmTarget *this,string *config,bool pimplib)

{
  bool bVar1;
  TargetType TVar2;
  ulong uVar3;
  char *pcVar4;
  string *psVar5;
  allocator local_161;
  string local_160;
  char *local_140;
  char *implib;
  char *config_implib;
  undefined1 local_128 [8];
  string impProp_1;
  string local_100;
  char *local_e0;
  char *location;
  char *config_location;
  undefined1 local_c8 [8];
  string impProp;
  string suffix;
  char *imp;
  char *loc;
  string local_68;
  undefined1 local_48 [8];
  string config_upper;
  bool pimplib_local;
  string *config_local;
  cmTarget *this_local;
  string *result;
  
  config_upper.field_2._M_local_buf[0xf] = pimplib;
  bVar1 = IsImported(this);
  if (bVar1) {
    std::__cxx11::string::string((string *)local_48);
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) == 0) {
      cmsys::SystemTools::UpperCase(&local_68,config);
      std::__cxx11::string::operator=((string *)local_48,(string *)&local_68);
      std::__cxx11::string::~string((string *)&local_68);
    }
    else {
      std::__cxx11::string::operator=((string *)local_48,"NOCONFIG");
    }
    loc._3_1_ = 0;
    std::__cxx11::string::string((string *)__return_storage_ptr__);
    imp = (char *)0x0;
    suffix.field_2._8_8_ = 0;
    std::__cxx11::string::string((string *)(impProp.field_2._M_local_buf + 8));
    TVar2 = GetType(this);
    if ((TVar2 != INTERFACE_LIBRARY) &&
       (bVar1 = GetMappedConfig(this,(string *)local_48,&imp,(char **)((long)&suffix.field_2 + 8),
                                (string *)((long)&impProp.field_2 + 8)), bVar1)) {
      if ((config_upper.field_2._M_local_buf[0xf] & 1U) == 0) {
        if (imp == (char *)0x0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)local_c8,"IMPORTED_LOCATION",
                     (allocator *)((long)&config_location + 7));
          std::allocator<char>::~allocator((allocator<char> *)((long)&config_location + 7));
          std::__cxx11::string::operator+=
                    ((string *)local_c8,(string *)(impProp.field_2._M_local_buf + 8));
          location = GetProperty(this,(string *)local_c8);
          if (location == (char *)0x0) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      ((string *)&local_100,"IMPORTED_LOCATION",
                       (allocator *)(impProp_1.field_2._M_local_buf + 0xf));
            pcVar4 = GetProperty(this,&local_100);
            std::__cxx11::string::~string((string *)&local_100);
            std::allocator<char>::~allocator
                      ((allocator<char> *)(impProp_1.field_2._M_local_buf + 0xf));
            local_e0 = pcVar4;
            if (pcVar4 != (char *)0x0) {
              std::__cxx11::string::operator=((string *)__return_storage_ptr__,pcVar4);
            }
          }
          else {
            std::__cxx11::string::operator=((string *)__return_storage_ptr__,location);
          }
          std::__cxx11::string::~string((string *)local_c8);
        }
        else {
          std::__cxx11::string::operator=((string *)__return_storage_ptr__,imp);
        }
      }
      else if (suffix.field_2._8_8_ == 0) {
        TVar2 = GetType(this);
        if ((TVar2 == SHARED_LIBRARY) || (bVar1 = IsExecutableWithExports(this), bVar1)) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)local_128,"IMPORTED_IMPLIB",(allocator *)((long)&config_implib + 7));
          std::allocator<char>::~allocator((allocator<char> *)((long)&config_implib + 7));
          std::__cxx11::string::operator+=
                    ((string *)local_128,(string *)(impProp.field_2._M_local_buf + 8));
          implib = GetProperty(this,(string *)local_128);
          if (implib == (char *)0x0) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string((string *)&local_160,"IMPORTED_IMPLIB",&local_161);
            pcVar4 = GetProperty(this,&local_160);
            std::__cxx11::string::~string((string *)&local_160);
            std::allocator<char>::~allocator((allocator<char> *)&local_161);
            local_140 = pcVar4;
            if (pcVar4 != (char *)0x0) {
              std::__cxx11::string::operator=((string *)__return_storage_ptr__,pcVar4);
            }
          }
          else {
            std::__cxx11::string::operator=((string *)__return_storage_ptr__,implib);
          }
          std::__cxx11::string::~string((string *)local_128);
        }
      }
      else {
        std::__cxx11::string::operator=
                  ((string *)__return_storage_ptr__,(char *)suffix.field_2._8_8_);
      }
    }
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) != 0) {
      psVar5 = GetName_abi_cxx11_(this);
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)psVar5);
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"-NOTFOUND");
    }
    loc._3_1_ = 1;
    std::__cxx11::string::~string((string *)(impProp.field_2._M_local_buf + 8));
    if ((loc._3_1_ & 1) == 0) {
      std::__cxx11::string::~string((string *)__return_storage_ptr__);
    }
    std::__cxx11::string::~string((string *)local_48);
    return __return_storage_ptr__;
  }
  __assert_fail("this->IsImported()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/cmTarget.cxx"
                ,0x795,"std::string cmTarget::ImportedGetFullPath(const std::string &, bool) const")
  ;
}

Assistant:

std::string
cmTarget::ImportedGetFullPath(const std::string& config, bool pimplib) const
{
  assert(this->IsImported());

  // Lookup/compute/cache the import information for this
  // configuration.
  std::string config_upper;
  if(!config.empty())
    {
    config_upper = cmSystemTools::UpperCase(config);
    }
  else
    {
    config_upper = "NOCONFIG";
    }

  std::string result;

  const char* loc = 0;
  const char* imp = 0;
  std::string suffix;

  if(this->GetType() != cmState::INTERFACE_LIBRARY
     && this->GetMappedConfig(config_upper, &loc, &imp, suffix))
    {
    if (!pimplib)
      {
      if(loc)
        {
        result = loc;
        }
      else
        {
        std::string impProp = "IMPORTED_LOCATION";
        impProp += suffix;
        if(const char* config_location = this->GetProperty(impProp))
          {
          result = config_location;
          }
        else if(const char* location =
                this->GetProperty("IMPORTED_LOCATION"))
          {
          result = location;
          }
        }
      }
    else
      {
      if(imp)
        {
        result = imp;
        }
      else if(this->GetType() == cmState::SHARED_LIBRARY ||
              this->IsExecutableWithExports())
        {
        std::string impProp = "IMPORTED_IMPLIB";
        impProp += suffix;
        if(const char* config_implib = this->GetProperty(impProp))
          {
          result = config_implib;
          }
        else if(const char* implib = this->GetProperty("IMPORTED_IMPLIB"))
          {
          result = implib;
          }
        }
      }
    }

  if(result.empty())
    {
    result = this->GetName();
    result += "-NOTFOUND";
    }
  return result;
}